

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O2

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitSwitch
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,Switch *curr,
          optional<wasm::Type> labelType)

{
  if (((undefined1  [16])
       labelType.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type> & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    if (labelType.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload != (_Storage<wasm::Type,_true>)0x0) {
      IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
                ((ConstraintCollector *)this,&curr->value,
                 labelType.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::Type>._M_payload._M_value);
    }
    IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
              ((ConstraintCollector *)this,&curr->condition,(Type)0x2);
    return;
  }
  handle_unreachable("labels should be explicitly provided",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-ir-builder.cpp"
                     ,0x17f);
}

Assistant:

void visitSwitch(Switch* curr, std::optional<Type> labelType = std::nullopt) {
    if (!labelType) {
      Type glb = getLabelType(curr->default_);
      for (auto label : curr->targets) {
        glb = Type::getGreatestLowerBound(glb, getLabelType(label));
      }
      labelType = glb;
    }
    if (*labelType != Type::none) {
      note(&curr->value, *labelType);
    }
    note(&curr->condition, Type::i32);
  }